

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall Table::push_new_value_in_column(Table *this,int cnt,string *value)

{
  __tuple_element_t<1UL,_tuple<basic_string<char>,_types,_int>_> _Var1;
  int iVar2;
  reference pvVar3;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_types,_int>_> *p_Var4;
  reference pvVar5;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_types,_int>_> *p_Var6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  double local_30;
  long local_28;
  string *local_20;
  string *value_local;
  Table *pTStack_10;
  int cnt_local;
  Table *this_local;
  
  local_20 = value;
  value_local._4_4_ = cnt;
  pTStack_10 = this;
  pvVar3 = std::
           vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
           ::operator[](&this->columns,(long)cnt);
  p_Var4 = std::get<1ul,std::__cxx11::string,Table::types,int>(pvVar3);
  _Var1 = *p_Var4;
  if (_Var1 == STRING) {
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)value_local._4_4_);
    p_Var6 = std::get<2ul,std::__cxx11::string,Table::types,int>(pvVar3);
    pvVar9 = std::
             vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&this->string_cols,(long)*p_Var6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pvVar9->second,value);
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)value_local._4_4_);
    p_Var6 = std::get<2ul,std::__cxx11::string,Table::types,int>(pvVar3);
    pvVar9 = std::
             vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&this->string_cols,(long)*p_Var6);
    sVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pvVar9->second);
    if ((ulong)(long)this->rows < sVar8) {
      this->rows = this->rows + 1;
    }
  }
  else if (_Var1 == INT) {
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)value_local._4_4_);
    p_Var6 = std::get<2ul,std::__cxx11::string,Table::types,int>(pvVar3);
    pvVar5 = std::
             vector<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
             ::operator[](&this->int_cols,(long)*p_Var6);
    iVar2 = std::__cxx11::stoi(value,(size_t *)0x0,10);
    local_28 = (long)iVar2;
    std::vector<long_long,_std::allocator<long_long>_>::push_back(&pvVar5->second,&local_28);
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)value_local._4_4_);
    p_Var6 = std::get<2ul,std::__cxx11::string,Table::types,int>(pvVar3);
    pvVar5 = std::
             vector<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
             ::operator[](&this->int_cols,(long)*p_Var6);
    sVar8 = std::vector<long_long,_std::allocator<long_long>_>::size(&pvVar5->second);
    if ((ulong)(long)this->rows < sVar8) {
      this->rows = this->rows + 1;
    }
  }
  else {
    if (_Var1 != FLOAT) {
      std::operator<<((ostream *)&std::cerr,"push_new_value_in_column\n");
      exit(1);
    }
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)value_local._4_4_);
    p_Var6 = std::get<2ul,std::__cxx11::string,Table::types,int>(pvVar3);
    pvVar7 = std::
             vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator[](&this->float_cols,(long)*p_Var6);
    local_30 = std::__cxx11::stod(value,(size_t *)0x0);
    std::vector<double,_std::allocator<double>_>::push_back(&pvVar7->second,&local_30);
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)value_local._4_4_);
    p_Var6 = std::get<2ul,std::__cxx11::string,Table::types,int>(pvVar3);
    pvVar7 = std::
             vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator[](&this->float_cols,(long)*p_Var6);
    sVar8 = std::vector<double,_std::allocator<double>_>::size(&pvVar7->second);
    if ((ulong)(long)this->rows < sVar8) {
      this->rows = this->rows + 1;
    }
  }
  return;
}

Assistant:

void push_new_value_in_column(int cnt, std::string value) {
        switch (std::get<1>(columns[cnt])) {
            case INT:
                int_cols[std::get<2>(columns[cnt])].second.push_back(std::stoi(value));
                if (int_cols[std::get<2>(columns[cnt])].second.size() > rows) rows++;
                break;
            case FLOAT:
                float_cols[std::get<2>(columns[cnt])].second.push_back(std::stod(value));
                if (float_cols[std::get<2>(columns[cnt])].second.size() > rows) rows++;
                break;
            case STRING:
                string_cols[std::get<2>(columns[cnt])].second.push_back(value);
                if (string_cols[std::get<2>(columns[cnt])].second.size() > rows) rows++;
                break;
            default:
                std::cerr << "push_new_value_in_column\n";
                exit(EXIT_FAILURE);
        }
    }